

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_IsArray(JSContext *ctx,JSValue val)

{
  JSValue *pJVar1;
  uint uVar2;
  int iVar3;
  JSValueUnion JVar4;
  
  JVar4 = val.u;
  uVar2 = 0;
  if ((int)val.tag == -1) {
    if (*(short *)((long)JVar4.ptr + 6) == 0x29) {
      iVar3 = 0;
      if ((*(short *)((long)JVar4.ptr + 6) == 0x29) &&
         (pJVar1 = *(JSValue **)((long)JVar4.ptr + 0x30), pJVar1 != (JSValue *)0x0)) {
        if (*(char *)((long)&pJVar1[2].u + 1) == '\0') {
          iVar3 = JS_IsArray(ctx,*pJVar1);
          return iVar3;
        }
        JS_ThrowTypeError(ctx,"revoked proxy");
        iVar3 = -1;
      }
      return iVar3;
    }
    uVar2 = (uint)(*(short *)((long)JVar4.ptr + 6) == 2);
  }
  return uVar2;
}

Assistant:

int JS_IsArray(JSContext *ctx, JSValueConst val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(val);
        if (unlikely(p->class_id == JS_CLASS_PROXY))
            return js_proxy_isArray(ctx, val);
        else
            return p->class_id == JS_CLASS_ARRAY;
    } else {
        return FALSE;
    }
}